

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_dtls_replay_check(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = 0;
  if ((ssl->conf->field_0x175 & 0x10) != 0) {
    puVar1 = ssl->in_ctr;
    uVar4 = (ulong)puVar1[7] |
            (ulong)puVar1[6] << 8 |
            (ulong)puVar1[5] << 0x10 |
            (ulong)puVar1[4] << 0x18 | (ulong)puVar1[3] << 0x20 | (ulong)puVar1[2] << 0x28;
    uVar3 = ssl->in_window_top - uVar4;
    iVar2 = 0;
    if ((uVar4 <= ssl->in_window_top) && (iVar2 = -1, uVar3 < 0x40)) {
      iVar2 = -(uint)((ssl->in_window >> (uVar3 & 0x3f) & 1) != 0);
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_dtls_replay_check( mbedtls_ssl_context *ssl )
{
    uint64_t rec_seqnum = ssl_load_six_bytes( ssl->in_ctr + 2 );
    uint64_t bit;

    if( ssl->conf->anti_replay == MBEDTLS_SSL_ANTI_REPLAY_DISABLED )
        return( 0 );

    if( rec_seqnum > ssl->in_window_top )
        return( 0 );

    bit = ssl->in_window_top - rec_seqnum;

    if( bit >= 64 )
        return( -1 );

    if( ( ssl->in_window & ( (uint64_t) 1 << bit ) ) != 0 )
        return( -1 );

    return( 0 );
}